

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O3

vec3 vec3_rotate_x(vec3 v,float theta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  vec3 vVar8;
  undefined4 local_38;
  
  fVar4 = v.z;
  fVar3 = v.y;
  fVar1 = cosf(theta);
  fVar2 = sinf(theta);
  local_38 = v.x;
  fVar6 = fVar3 * 0.0 + local_38 + fVar4 * 0.0;
  fVar7 = 1.0 - fVar1;
  fVar5 = fVar6 * 0.0;
  vVar8.x = fVar2 * (fVar4 * 0.0 + fVar3 * -0.0) + fVar7 * fVar6 + fVar1 * local_38;
  vVar8.y = fVar2 * (-fVar4 + local_38 * 0.0) + fVar7 * fVar5 + fVar1 * fVar3;
  vVar8.z = (local_38 * -0.0 + fVar3) * fVar2 + fVar5 * fVar7 + fVar1 * fVar4;
  return vVar8;
}

Assistant:

vec3 vec3_rotate_x(vec3 v, float theta) {
    return vec3_rotate_about_axis(v, V3(1.0f, 0.0f, 0.0f), theta);
}